

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

ExtPrivkey * __thiscall
cfd::core::HDWallet::GeneratePrivkey
          (ExtPrivkey *__return_storage_ptr__,HDWallet *this,NetType network_type,uint32_t child_num
          )

{
  initializer_list<unsigned_int> __l;
  allocator<unsigned_int> local_4d;
  uint32_t local_4c;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  uint32_t child_num_local;
  NetType network_type_local;
  HDWallet *this_local;
  
  local_48 = &local_4c;
  local_40 = 1;
  local_4c = child_num;
  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = child_num;
  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = network_type;
  ::std::allocator<unsigned_int>::allocator(&local_4d);
  __l._M_len = local_40;
  __l._M_array = local_48;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,__l,&local_4d);
  ::std::allocator<unsigned_int>::~allocator(&local_4d);
  GeneratePrivkey(__return_storage_ptr__,this,
                  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_,
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

ExtPrivkey HDWallet::GeneratePrivkey(
    NetType network_type, uint32_t child_num) const {
  std::vector<uint32_t> path = {child_num};
  return GeneratePrivkey(network_type, path);
}